

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32_t tag,CodedOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  int64_t iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte *pbVar13;
  ulong uVar14;
  size_t __n;
  uint8_t *puVar15;
  uint32_t first_byte_or_zero;
  ulong uVar16;
  pair<unsigned_long,_bool> pVar17;
  string temp;
  string local_50;
  
  if (tag < 8) {
    return false;
  }
  bVar5 = false;
  bVar12 = (byte)tag;
  switch(tag & 7) {
  case 0:
    puVar15 = input->buffer_;
    if ((puVar15 < input->buffer_end_) && (uVar16 = (ulong)(char)*puVar15, -1 < (long)uVar16)) {
      input->buffer_ = puVar15 + 1;
    }
    else {
      pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar17.first;
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar12;
    if (tag < 0x80) {
      pbVar13 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar12 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar13 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar13[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar13 = (byte)uVar11;
          pbVar13 = pbVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar13;
    if ((output->impl_).end_ <= pbVar13) {
      pbVar13 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
    }
    output->cur_ = pbVar13;
    *pbVar13 = (byte)uVar16;
    if (uVar16 < 0x80) {
      pbVar9 = pbVar13 + 1;
    }
    else {
      *pbVar13 = (byte)uVar16 | 0x80;
      pbVar13[1] = (byte)(uVar16 >> 7);
      pbVar9 = pbVar13 + 2;
      if (0x3fff < uVar16) {
        uVar14 = (ulong)pbVar13[1];
        uVar16 = uVar16 >> 7;
        do {
          pbVar9[-1] = (byte)uVar14 | 0x80;
          uVar7 = uVar16 >> 7;
          *pbVar9 = (byte)uVar7;
          pbVar9 = pbVar9 + 1;
          uVar14 = uVar7 & 0xffffffff;
          bVar5 = 0x3fff < uVar16;
          uVar16 = uVar7;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar9;
    goto LAB_0037ff33;
  case 1:
    puVar15 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar15 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_50);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p = *(pointer *)puVar15;
      input->buffer_ = puVar15 + 8;
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    _Var4._M_p = local_50._M_dataplus._M_p;
    output->cur_ = pbVar9;
    *pbVar9 = bVar12;
    if (tag < 0x80) {
      pbVar13 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar12 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar13 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar13[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar13 = (byte)uVar11;
          pbVar13 = pbVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar13;
    if ((output->impl_).end_ <= pbVar13) {
      pbVar13 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
    }
    *(pointer *)pbVar13 = _Var4._M_p;
    pbVar13 = pbVar13 + 8;
    break;
  case 2:
    pbVar9 = input->buffer_;
    if (pbVar9 < input->buffer_end_) {
      bVar1 = *pbVar9;
      first_byte_or_zero = (uint32_t)bVar1;
      uVar10 = (uint)bVar1;
      if (-1 < (char)bVar1) {
        input->buffer_ = pbVar9 + 1;
        goto LAB_0037ff62;
      }
    }
    else {
      first_byte_or_zero = 0;
    }
    iVar8 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
    uVar10 = (uint)iVar8;
    if (iVar8 < 0) {
      return false;
    }
LAB_0037ff62:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar12;
    if (tag < 0x80) {
      pbVar13 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar12 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar13 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar6 = (uint)pbVar9[1];
        uVar11 = tag >> 7;
        do {
          pbVar13[-1] = (byte)uVar6 | 0x80;
          uVar6 = uVar11 >> 7;
          *pbVar13 = (byte)uVar6;
          pbVar13 = pbVar13 + 1;
          bVar5 = 0x3fff < uVar11;
          uVar11 = uVar6;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar13;
    if ((output->impl_).end_ <= pbVar13) {
      pbVar13 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
    }
    output->cur_ = pbVar13;
    *pbVar13 = (byte)uVar10;
    if (uVar10 < 0x80) {
      pbVar9 = pbVar13 + 1;
    }
    else {
      *pbVar13 = (byte)uVar10 | 0x80;
      pbVar13[1] = (byte)(uVar10 >> 7);
      pbVar9 = pbVar13 + 2;
      if (0x3fff < uVar10) {
        uVar6 = (uint)pbVar13[1];
        uVar11 = uVar10 >> 7;
        do {
          pbVar9[-1] = (byte)uVar6 | 0x80;
          uVar6 = uVar11 >> 7;
          *pbVar9 = (byte)uVar6;
          pbVar9 = pbVar9 + 1;
          bVar5 = 0x3fff < uVar11;
          uVar11 = uVar6;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar9;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar5 = io::CodedInputStream::ReadString(input,&local_50,uVar10);
    if (bVar5) {
      puVar15 = output->cur_;
      __n = (size_t)(int)local_50._M_string_length;
      if ((long)(output->impl_).end_ - (long)puVar15 < (long)__n) {
        puVar15 = io::EpsCopyOutputStream::WriteRawFallback
                            (&output->impl_,local_50._M_dataplus._M_p,(int)local_50._M_string_length
                             ,puVar15);
      }
      else {
        memcpy(puVar15,local_50._M_dataplus._M_p,__n);
        puVar15 = puVar15 + __n;
      }
      output->cur_ = puVar15;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      return bVar5;
    }
    return bVar5;
  case 3:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar12;
    if (tag < 0x80) {
      pbVar13 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar12 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar13 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar13[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar13 = (byte)uVar11;
          pbVar13 = pbVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar13;
    iVar2 = input->recursion_budget_;
    input->recursion_budget_ = iVar2 + -1;
    if (iVar2 < 1) {
      return false;
    }
    bVar5 = SkipMessage(input,output);
    if (!bVar5) {
      return false;
    }
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
    }
    return input->last_tag_ == (tag & 0xfffffff8 | 4);
  default:
    goto switchD_0037fc1a_caseD_4;
  case 5:
    puVar15 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar15 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_50);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar15;
      input->buffer_ = puVar15 + 4;
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    output->cur_ = pbVar9;
    *pbVar9 = bVar12;
    if (tag < 0x80) {
      pbVar13 = pbVar9 + 1;
    }
    else {
      *pbVar9 = bVar12 | 0x80;
      pbVar9[1] = (byte)(tag >> 7);
      pbVar13 = pbVar9 + 2;
      if (0x3fff < tag) {
        uVar11 = (uint)pbVar9[1];
        uVar10 = tag >> 7;
        do {
          pbVar13[-1] = (byte)uVar11 | 0x80;
          uVar11 = uVar10 >> 7;
          *pbVar13 = (byte)uVar11;
          pbVar13 = pbVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
      }
    }
    output->cur_ = pbVar13;
    uVar3 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar13) {
      pbVar13 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
    }
    *(undefined4 *)pbVar13 = uVar3;
    pbVar13 = pbVar13 + 4;
  }
  output->cur_ = pbVar13;
LAB_0037ff33:
  bVar5 = true;
switchD_0037fc1a_caseD_4:
  return bVar5;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}